

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O0

bool benchmark::MyCPUUsageCPUTimeNsLocked(double *cputime)

{
  ssize_t sVar1;
  ulonglong uVar2;
  unsigned_long_long uVar3;
  undefined1 auVar4 [16];
  unsigned_long_long result;
  char buff [64];
  double *cputime_local;
  
  buff._56_8_ = cputime;
  if ((MyCPUUsageCPUTimeNsLocked::cputime_fd == -1) &&
     (MyCPUUsageCPUTimeNsLocked::cputime_fd = open("/proc/self/cputime_ns",0),
     MyCPUUsageCPUTimeNsLocked::cputime_fd < 0)) {
    MyCPUUsageCPUTimeNsLocked::cputime_fd = -1;
    cputime_local._7_1_ = false;
  }
  else {
    memset(&result,0,0x40);
    sVar1 = pread(MyCPUUsageCPUTimeNsLocked::cputime_fd,&result,0x3f,0);
    if (sVar1 < 1) {
      close(MyCPUUsageCPUTimeNsLocked::cputime_fd);
      MyCPUUsageCPUTimeNsLocked::cputime_fd = -1;
      cputime_local._7_1_ = false;
    }
    else {
      uVar2 = strtoull((char *)&result,(char **)0x0,0);
      uVar3 = std::numeric_limits<unsigned_long_long>::max();
      if (uVar2 == uVar3) {
        close(MyCPUUsageCPUTimeNsLocked::cputime_fd);
        MyCPUUsageCPUTimeNsLocked::cputime_fd = -1;
        cputime_local._7_1_ = false;
      }
      else {
        auVar4._8_4_ = (int)(uVar2 >> 0x20);
        auVar4._0_8_ = uVar2;
        auVar4._12_4_ = 0x45300000;
        *(double *)buff._56_8_ =
             ((auVar4._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) / 1000000000.0;
        cputime_local._7_1_ = true;
      }
    }
  }
  return cputime_local._7_1_;
}

Assistant:

static bool MyCPUUsageCPUTimeNsLocked(double* cputime) {
  static int cputime_fd = -1;
  if (cputime_fd == -1) {
    cputime_fd = open("/proc/self/cputime_ns", O_RDONLY);
    if (cputime_fd < 0) {
      cputime_fd = -1;
      return false;
    }
  }
  char buff[64];
  memset(buff, 0, sizeof(buff));
  if (pread(cputime_fd, buff, sizeof(buff) - 1, 0) <= 0) {
    close(cputime_fd);
    cputime_fd = -1;
    return false;
  }
  unsigned long long result = strtoull(buff, nullptr, 0);
  if (result == (std::numeric_limits<unsigned long long>::max)()) {
    close(cputime_fd);
    cputime_fd = -1;
    return false;
  }
  *cputime = static_cast<double>(result) / 1e9;
  return true;
}